

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O3

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  byte bVar1;
  keeponval kVar2;
  Curl_handler *pCVar3;
  ulong uVar4;
  long lVar5;
  dynbuf *pdVar6;
  Curl_chunker *pCVar7;
  _Bool *p_Var8;
  _Bool *p_Var9;
  _Bool _Var10;
  CURLcode CVar11;
  int iVar12;
  uint uVar13;
  h1_tunnel_state_conflict *ts;
  timediff_t tVar14;
  size_t size;
  char *pcVar15;
  size_t sVar16;
  char *auth;
  curl_trc_feat *pcVar17;
  bool bVar18;
  char byte;
  ssize_t nread;
  char *in_stack_ffffffffffffff58;
  _Bool local_9a;
  char local_99;
  h1_tunnel_state_conflict *local_98;
  httpreq *local_90;
  CURLcode local_84;
  connectdata *local_80;
  size_t *local_78;
  connectdata **local_70;
  _Bool *local_68;
  curl_off_t *local_60;
  dynbuf *local_58;
  Curl_chunker *local_50;
  char *local_48;
  SingleRequest *local_40;
  long local_38;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  ts = (h1_tunnel_state_conflict *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 || (0 < pcVar17->log_level))))
     && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect");
  }
  CVar11 = (*(code *)cf->next->cft->do_connect)(cf->next,data,done);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  if (ts == (h1_tunnel_state_conflict *)0x0) {
    pCVar3 = cf->conn->handler;
    if ((pCVar3->flags & 0x4000) != 0) {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar3->scheme);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    ts = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0xb0);
    if (ts == (h1_tunnel_state_conflict *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 || (0 < pcVar17->log_level)))
       ) {
      Curl_infof(data,"allocate connect buffer");
    }
    Curl_dyn_init((dynbuf *)ts,0x4000);
    Curl_dyn_init(&ts->request_data,0x100000);
    Curl_httpchunk_init(data,&ts->ch,true);
    local_70 = &cf->conn;
    Curl_conncontrol(cf->conn,0);
    Curl_dyn_reset((dynbuf *)ts);
    Curl_dyn_reset(&ts->request_data);
    ts->tunnel_state = H1_TUNNEL_INIT;
    ts->keepon = KEEPON_CONNECT;
    ts->cl = 0;
    ts->field_0xac = ts->field_0xac & 0xfd;
    cf->ctx = ts;
  }
  else {
    if (ts->tunnel_state == H1_TUNNEL_ESTABLISHED) goto LAB_00113f9c;
    CVar11 = CURLE_RECV_ERROR;
    if (ts->tunnel_state == H1_TUNNEL_FAILED) goto LAB_001140a7;
    local_70 = &cf->conn;
  }
  local_80 = cf->conn;
  local_58 = &ts->request_data;
  local_78 = &ts->nsent;
  local_60 = &ts->cl;
  local_50 = &ts->ch;
  local_40 = &data->req;
  local_98 = ts;
  do {
    tVar14 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar14 < 1) {
      Curl_failf(data,"Proxy CONNECT aborted due to timeout");
      CVar11 = CURLE_OPERATION_TIMEDOUT;
LAB_00114090:
      h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
      goto LAB_001140a7;
    }
    switch(ts->tunnel_state) {
    case H1_TUNNEL_INIT:
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
           (0 < pcVar17->log_level)))) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT start");
      }
      local_90 = (httpreq *)0x0;
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      CVar11 = Curl_http_proxy_create_CONNECT(&local_90,cf,data,1);
      if (CVar11 == CURLE_OK) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
            (0 < pcVar17->log_level)))) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s",local_90->authority);
        }
        pdVar6 = local_58;
        Curl_dyn_reset(local_58);
        *local_78 = 0;
        local_78[1] = 0;
        CVar11 = Curl_h1_req_write_head
                           (local_90,(uint)(((*local_70)->http_proxy).proxytype != '\x01'),pdVar6);
        if ((CVar11 != CURLE_OK) || (CVar11 = Curl_creader_set_null(data), CVar11 != CURLE_OK))
        goto LAB_001134c1;
        CVar11 = CURLE_OK;
      }
      else {
LAB_001134c1:
        Curl_failf(data,"Failed sending CONNECT to proxy");
      }
      if (local_90 != (httpreq *)0x0) {
        Curl_http_req_free(local_90);
      }
      if (CVar11 != CURLE_OK) goto LAB_00114090;
      h1_tunnel_go_state(cf,ts,H1_TUNNEL_CONNECT,data);
LAB_0011350f:
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         (((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
           (0 < pcVar17->log_level)) && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"CONNECT send");
      }
      break;
    case H1_TUNNEL_CONNECT:
      if (data != (Curl_easy *)0x0) goto LAB_0011350f;
      break;
    case H1_TUNNEL_RECEIVE:
      goto switchD_001133c3_caseD_2;
    case H1_TUNNEL_RESPONSE:
      goto switchD_001133c3_caseD_3;
    default:
      goto switchD_001133c3_default;
    }
    pdVar6 = local_58;
    pcVar15 = Curl_dyn_ptr(local_58);
    sVar16 = Curl_dyn_len(pdVar6);
    local_90 = (httpreq *)((ulong)local_90 & 0xffffffff00000000);
    uVar4 = *local_78;
    if (uVar4 <= sVar16 && sVar16 - uVar4 != 0) {
      size = (*cf->next->cft->do_send)
                       (cf->next,data,pcVar15 + uVar4,sVar16 - uVar4,false,(CURLcode *)&local_90);
      if ((long)size < 0) {
        if ((CURLcode)local_90 == 0x51) goto LAB_001135e5;
      }
      else {
        *local_78 = *local_78 + size;
        Curl_debug(data,CURLINFO_HEADER_OUT,pcVar15 + uVar4,size);
      }
      if ((CURLcode)local_90 != 0) {
        Curl_failf(data,"Failed sending CONNECT to proxy");
        if ((CURLcode)local_90 != CURLE_OK) {
          local_9a = false;
          ts = local_98;
          CVar11 = (CURLcode)local_90;
          goto LAB_00114090;
        }
      }
    }
LAB_001135e5:
    ts = local_98;
    if (*local_78 < sVar16) goto LAB_00113f9c;
    h1_tunnel_go_state(cf,local_98,H1_TUNNEL_RECEIVE,data);
switchD_001133c3_caseD_2:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 || (0 < pcVar17->log_level))
        )) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT receive");
    }
    local_9a = false;
    _Var10 = Curl_conn_data_pending(data,cf->sockindex);
    if (_Var10) {
      local_84 = CURLE_OK;
      kVar2 = ts->keepon;
      p_Var9 = done;
      p_Var8 = local_68;
      while (local_68 = p_Var9, kVar2 != KEEPON_DONE) {
        CVar11 = Curl_conn_recv(data,cf->sockindex,&local_99,1,&local_38);
        if (CVar11 == CURLE_AGAIN) {
          ts = local_98;
          CVar11 = CURLE_OK;
          goto LAB_00113c46;
        }
        iVar12 = Curl_pgrsUpdate(data);
        pCVar7 = local_50;
        ts = local_98;
        if (iVar12 != 0) {
          CVar11 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_00113c46;
        }
        if (CVar11 != CURLE_OK) {
          local_98->keepon = KEEPON_DONE;
          local_9a = true;
          bVar18 = true;
          local_84 = CVar11;
          goto LAB_00113c49;
        }
        if (local_38 < 1) {
          if ((((data->set).proxyauth != 0) && ((data->state).authproxy.avail != 0)) &&
             ((data->state).aptr.proxyuserpwd != (char *)0x0)) {
            local_98->field_0xac = local_98->field_0xac | 2;
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                (0 < pcVar17->log_level)))) {
              Curl_infof(data,"Proxy CONNECT connection closed");
            }
            goto LAB_00113da0;
          }
          Curl_failf(data,"Proxy CONNECT aborted");
          ts->keepon = KEEPON_DONE;
          local_9a = true;
          iVar12 = Curl_pgrsUpdate(data);
          CVar11 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar12 == 0) {
            CVar11 = CURLE_RECV_ERROR;
          }
          goto LAB_00114090;
        }
        if (local_98->keepon == KEEPON_IGNORE) {
          lVar5 = *local_60;
          if (lVar5 == 0) {
            if ((local_98->field_0xac & 1) != 0) {
              local_90 = (httpreq *)0x0;
              CVar11 = Curl_httpchunk_read(data,local_50,&local_99,1,(size_t *)&local_90);
              if (CVar11 == CURLE_OK) {
                _Var10 = Curl_httpchunk_is_done(data,pCVar7);
                if (_Var10) {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                     ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar17->log_level)))) {
                    Curl_infof(data,"chunk reading DONE");
                  }
                  ts->keepon = KEEPON_DONE;
                }
                goto LAB_00113a8b;
              }
              goto LAB_00113c46;
            }
          }
          else {
            *local_60 = lVar5 + -1;
            if (lVar5 < 2) goto LAB_00113da0;
          }
        }
        else {
          CVar11 = Curl_dyn_addn(&local_98->rcvbuf,&local_99,1);
          if (CVar11 != CURLE_OK) {
            Curl_failf(data,"CONNECT response too large");
            CVar11 = CURLE_RECV_ERROR;
            goto LAB_00113c46;
          }
          if (local_99 == '\n') {
            ts->headerlines = ts->headerlines + 1;
            pcVar15 = Curl_dyn_ptr(&ts->rcvbuf);
            sVar16 = Curl_dyn_len(&ts->rcvbuf);
            Curl_debug(data,CURLINFO_HEADER_IN,pcVar15,sVar16);
            CVar11 = Curl_client_write(data,(uint)(ts->headerlines == 1) * 8 + 0x14,pcVar15,sVar16);
            ts = local_98;
            done = local_68;
            if ((CVar11 != CURLE_OK) ||
               (CVar11 = Curl_bump_headersize(data,sVar16,true), done = local_68, ts = local_98,
               CVar11 != CURLE_OK)) goto LAB_00113c46;
            if ((*pcVar15 == '\r') || (*pcVar15 == '\n')) {
              if (((data->req).httpcode != 0x197) || (((data->state).field_0x7be & 0x80) != 0)) {
LAB_00113da0:
                ts->keepon = KEEPON_DONE;
                p_Var8 = local_68;
                break;
              }
              local_98->keepon = KEEPON_IGNORE;
              if (local_98->cl == 0) {
                uVar13 = (uint)*(undefined8 *)&(data->set).field_0x89c;
                if ((local_98->field_0xac & 1) == 0) {
                  if (((uVar13 >> 0x1e & 1) != 0) &&
                     (((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                       (0 < pcVar17->log_level)) && (0 < cf->cft->log_level)))) {
                    Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                  }
                  goto LAB_00113da0;
                }
                if (((uVar13 >> 0x1e & 1) != 0) &&
                   ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar17->log_level)))) {
                  Curl_infof(data,"Ignore chunked response-body");
                }
              }
              else if ((((data->set).field_0x89f & 0x40) != 0) &&
                      ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                       (0 < pcVar17->log_level)))) {
                Curl_infof(data,"Ignore %ld bytes of response-body");
              }
            }
            else {
              iVar12 = curl_strnequal(pcVar15,"WWW-Authenticate:",0x11);
              if ((iVar12 == 0) || ((data->req).httpcode != 0x191)) {
                iVar12 = curl_strnequal(pcVar15,"Proxy-authenticate:",0x13);
                if ((iVar12 != 0) && (_Var10 = true, (data->req).httpcode == 0x197))
                goto LAB_0011394c;
                iVar12 = curl_strnequal(pcVar15,"Content-Length:",0xf);
                pCVar7 = local_50;
                if (iVar12 == 0) {
                  _Var10 = Curl_compareheader(pcVar15,"Connection:",0xb,"close",5);
                  if (_Var10) {
LAB_00113a50:
                    local_98->field_0xac = local_98->field_0xac | 2;
                  }
                  else {
                    iVar12 = curl_strnequal(pcVar15,"Transfer-Encoding:",0x12);
                    if (iVar12 == 0) {
                      _Var10 = Curl_compareheader(pcVar15,"Proxy-Connection:",0x11,"close",5);
                      if (_Var10) goto LAB_00113a50;
                      iVar12 = strncmp(pcVar15,"HTTP/1.",7);
                      if (((((iVar12 == 0) && ((pcVar15[7] & 0xfeU) == 0x30)) && (pcVar15[8] == ' ')
                           ) && (((byte)(pcVar15[9] - 0x30U) < 10 &&
                                 (bVar1 = pcVar15[10], (byte)(bVar1 - 0x30) < 10)))) &&
                         (((byte)(pcVar15[0xb] - 0x30U) < 10 && (9 < (byte)(pcVar15[0xc] - 0x30U))))
                         ) {
                        iVar12 = (uint)(byte)pcVar15[9] * 100 + ((uint)bVar1 + (uint)bVar1 * 4) * 2
                                 + (uint)(byte)pcVar15[0xb] + -0x14d0;
                        (data->req).httpcode = iVar12;
                        (data->info).httpproxycode = iVar12;
                      }
                    }
                    else if ((data->req).httpcode - 200U < 100) {
                      if ((((data->set).field_0x89f & 0x40) != 0) &&
                         ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar17->log_level)))) {
                        pcVar15 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                        goto LAB_00113a22;
                      }
                    }
                    else {
                      _Var10 = Curl_compareheader(pcVar15,"Transfer-Encoding:",0x12,"chunked",7);
                      if (_Var10) {
                        if ((((data->set).field_0x89f & 0x40) != 0) &&
                           ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                            (0 < pcVar17->log_level)))) {
                          Curl_infof(data,"CONNECT responded chunked");
                        }
                        local_98->field_0xac = local_98->field_0xac | 1;
                        Curl_httpchunk_reset(data,pCVar7,true);
                      }
                    }
                  }
                }
                else if ((data->req).httpcode - 200U < 100) {
                  if ((((data->set).field_0x89f & 0x40) != 0) &&
                     ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar17->log_level)))) {
                    pcVar15 = "Ignoring Content-Length in CONNECT %03d response";
LAB_00113a22:
                    Curl_infof(data,pcVar15);
                  }
                }
                else {
                  local_90 = (httpreq *)(pcVar15 + 0xf);
                  iVar12 = Curl_str_numblanks((char **)&local_90,local_60);
                  if (iVar12 != 0) {
                    Curl_failf(data,"Unsupported Content-Length value");
                    ts = local_98;
                    CVar11 = CURLE_WEIRD_SERVER_REPLY;
                    goto LAB_00113c46;
                  }
                }
              }
              else {
                _Var10 = false;
LAB_0011394c:
                auth = Curl_copy_header_value(in_stack_ffffffffffffff58);
                if (auth == (char *)0x0) {
                  ts = local_98;
                  CVar11 = CURLE_OUT_OF_MEMORY;
                  goto LAB_00113c46;
                }
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   (((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar17->log_level)) && (0 < cf->cft->log_level)))) {
                  local_48 = auth;
                  Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",pcVar15);
                  auth = local_48;
                }
                CVar11 = Curl_http_input_auth(data,_Var10,auth);
                (*Curl_cfree)(auth);
                ts = local_98;
                if (CVar11 != CURLE_OK) goto LAB_00113c46;
              }
              ts = local_98;
              Curl_dyn_reset(&local_98->rcvbuf);
            }
          }
        }
LAB_00113a8b:
        p_Var9 = local_68;
        p_Var8 = local_68;
        kVar2 = ts->keepon;
      }
      local_68 = p_Var8;
      local_9a = true;
      bVar18 = true;
      if (99 < (data->info).httpproxycode - 200U) {
        local_84 = Curl_http_auth_act(data);
      }
    }
    else {
      local_84 = CURLE_OK;
      CVar11 = local_84;
LAB_00113c46:
      local_84 = CVar11;
      bVar18 = false;
    }
LAB_00113c49:
    iVar12 = Curl_pgrsUpdate(data);
    if (iVar12 != 0) {
      CVar11 = CURLE_ABORTED_BY_CALLBACK;
      goto LAB_00114090;
    }
    CVar11 = local_84;
    if (local_84 != CURLE_OK) goto LAB_00114090;
    if (!bVar18) goto LAB_00113f9c;
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_RESPONSE,data);
switchD_001133c3_caseD_3:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 || (0 < pcVar17->log_level))
        )) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT response");
    }
    if ((data->req).newurl == (char *)0x0) break;
    Curl_req_soft_reset(local_40,data);
    if (((ts->field_0xac & 2) != 0) || (((ulong)local_80->bits & 0x20) != 0)) {
      if (((data->set).field_0x89f & 0x40) != 0) {
        pcVar17 = (data->state).feat;
        if ((pcVar17 == (curl_trc_feat *)0x0) || (0 < pcVar17->log_level)) {
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"CONNECT need to close+open");
            if (((data->set).field_0x89f & 0x40) == 0) goto LAB_00113f6c;
            pcVar17 = (data->state).feat;
          }
          if (pcVar17 != (curl_trc_feat *)0x0) goto LAB_00113f55;
        }
        else {
LAB_00113f55:
          if (pcVar17->log_level < 1) goto LAB_00113f6c;
        }
        Curl_infof(data,"Connect me again please");
      }
LAB_00113f6c:
      Curl_conn_cf_close(cf,data);
      Curl_conncontrol(local_80,0);
      CVar11 = Curl_conn_cf_connect(cf->next,data,&local_9a);
      if (CVar11 != CURLE_OK) goto LAB_00114090;
      goto LAB_00113f9c;
    }
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_INIT,data);
switchD_001133c3_default:
  } while ((data->req).newurl != (char *)0x0);
  if (99 < (data->info).httpproxycode - 200U) {
    (*Curl_cfree)((void *)0x0);
    (data->req).newurl = (char *)0x0;
    Curl_conncontrol(local_80,2);
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
    Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
    CVar11 = CURLE_RECV_ERROR;
LAB_001140a7:
    *done = false;
    return CVar11;
  }
  h1_tunnel_go_state(cf,ts,H1_TUNNEL_ESTABLISHED,data);
  if ((((data->set).field_0x89f & 0x40) != 0) &&
     ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 || (0 < pcVar17->log_level))))
  {
    Curl_infof(data,"CONNECT tunnel established, response %d",
               (ulong)(uint)(data->info).httpproxycode);
  }
LAB_00113f9c:
  (*Curl_cfree)((data->state).aptr.proxyuserpwd);
  (data->state).aptr.proxyuserpwd = (char *)0x0;
  if (cf->ctx == (void *)0x0) {
    *done = false;
  }
  else {
    bVar18 = *(int *)((long)cf->ctx + 0xa8) == 4;
    *done = bVar18;
    if (bVar18) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_req_soft_reset(&data->req,data);
      Curl_client_reset(data);
      Curl_pgrsSetUploadCounter(data,0);
      Curl_pgrsSetDownloadCounter(data,0);
      tunnel_free(cf,data);
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* The real request will follow the CONNECT, reset request partially */
    Curl_req_soft_reset(&data->req, data);
    Curl_client_reset(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}